

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O3

int __thiscall chrono::ChLinkMask::SetAllDisabled(ChLinkMask *this,bool mdis)

{
  int iVar1;
  pointer ppCVar2;
  ChConstraintTwoBodies *pCVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  iVar1 = this->nconstr;
  if ((long)iVar1 < 1) {
    iVar4 = 0;
  }
  else {
    ppCVar2 = (this->constraints).
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar4 = 0;
    do {
      pCVar3 = ppCVar2[lVar5];
      if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.disabled != mdis) {
        (pCVar3->super_ChConstraintTwo).super_ChConstraint.disabled = mdis;
        if ((((pCVar3->super_ChConstraintTwo).super_ChConstraint.valid != true || mdis) ||
            ((pCVar3->super_ChConstraintTwo).super_ChConstraint.redundant != false)) ||
           ((pCVar3->super_ChConstraintTwo).super_ChConstraint.broken != false)) {
          bVar6 = false;
        }
        else {
          bVar6 = (pCVar3->super_ChConstraintTwo).super_ChConstraint.mode != CONSTRAINT_FREE;
        }
        iVar4 = iVar4 + 1;
        (pCVar3->super_ChConstraintTwo).super_ChConstraint.active = bVar6;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return iVar4;
}

Assistant:

int ChLinkMask::SetAllDisabled(bool mdis) {
    int cnt = 0;

    for (int i = 0; i < nconstr; i++) {
        if (Constr_N(i).IsDisabled() != mdis) {
            Constr_N(i).SetDisabled(mdis);
            cnt++;
        }
    }

    return cnt;
}